

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

int __thiscall DataServer::mkdir(DataServer *this,char *__path,__mode_t __mode)

{
  int iVar1;
  path local_c0;
  __cxx11 local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string folder;
  DataServer *this_local;
  
  std::__cxx11::to_string(local_90,this->serverId);
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "dfsfiles/datanode");
  std::operator+(local_50,(char *)local_70);
  std::operator+(local_30,local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_90);
  boost::filesystem::path::path(&local_c0,local_30);
  boost::filesystem::create_directories(&local_c0);
  boost::filesystem::path::~path(&local_c0);
  iVar1 = std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

void mkdir() const
    {
        string folder = "dfsfiles/datanode" + to_string(serverId) + "/" + mkdir_path;
        boost::filesystem::create_directories(folder);
    }